

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::QPDFArrayItems::iterator::iterator
          (iterator *this,QPDFObjectHandle *oh,bool for_begin)

{
  Members *this_00;
  bool for_begin_local;
  QPDFObjectHandle *oh_local;
  iterator *this_local;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_0058fe58;
  this_00 = (Members *)operator_new(0x10);
  Members::Members(this_00,oh,for_begin);
  std::shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members>::
  shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,void>(&this->m,this_00);
  QPDFObjectHandle(&this->ivalue);
  updateIValue(this);
  return;
}

Assistant:

QPDFObjectHandle::QPDFArrayItems::iterator::iterator(QPDFObjectHandle& oh, bool for_begin) :
    m(new Members(oh, for_begin))
{
    updateIValue();
}